

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

void __thiscall astar::Map::Print(Map *this)

{
  ostream *poVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x40);
  std::ostream::put(-0x40);
  std::ostream::flush();
  if (1 < this->n) {
    lVar6 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
      if ((long)this->m < 2) {
        lVar2 = (long)this->m + -1;
      }
      else {
        lVar5 = 0;
        do {
          poVar1 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              *(int *)(*(long *)&(this->map).
                                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl + lVar5 * 4));
          std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
          lVar5 = lVar5 + 1;
          lVar2 = (long)this->m + -1;
        } while (lVar5 < lVar2);
      }
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->map).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start[lVar6].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  lVar2 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"},",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      lVar6 = lVar6 + 1;
    } while (lVar6 < (long)this->n + -1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{",1);
  iVar4 = this->m;
  if (iVar4 < 2) {
    uVar3 = (ulong)(iVar4 - 1);
  }
  else {
    lVar6 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          *(int *)(*(long *)&(this->map).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start
                                             [(long)this->n + -1].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl +
                                  lVar6 * 4));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", ",2);
      lVar6 = lVar6 + 1;
      iVar4 = this->m;
      uVar3 = (long)iVar4 - 1;
    } while (lVar6 < (long)uVar3);
  }
  if (iVar4 < 1 || (long)this->n < 1) {
    return;
  }
  poVar1 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)&std::cout,
                      *(int *)(*(long *)&(this->map).
                                         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start
                                         [(long)this->n + -1].
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl +
                              (uVar3 & 0xffffffff) * 4));
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"}\n}",3);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void Map::Print()
{
    std::cout << "{" << std::endl;
    for (int i = 0; i < (n - 1); i++) {
        std::cout << "{";
        for (int j = 0; j < (m - 1); j++) {
            std::cout << map[i][j] << ", ";
        }
        std::cout << map[i][m - 1] << "}," << std::endl;
    }
    std::cout << "{";
    for (int j = 0; j < (m - 1); j++) {
        std::cout << map[n - 1][j] << ", ";
    }
    if (n > 0 && m > 0) {
        std::cout << map[n - 1][m - 1] << "}\n}" << std::endl;
    }
}